

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_node __thiscall
pugi::xml_node::find_child_by_attribute(xml_node *this,char_t *attr_name,char_t *attr_value)

{
  xml_node_struct *pxVar1;
  xml_node_struct *pxVar2;
  bool bVar3;
  char_t *dst;
  xml_attribute_struct *pxVar4;
  xml_node_struct *local_38;
  
  pxVar1 = this->_root;
  if (pxVar1 == (xml_node_struct *)0x0) {
    return (xml_node)(xml_node_struct *)0x0;
  }
  pxVar2 = pxVar1->first_child;
  do {
    if (pxVar2 == (xml_node_struct *)0x0) {
      return (xml_node)(xml_node_struct *)0x0;
    }
    for (pxVar4 = pxVar2->first_attribute; local_38 = pxVar1, pxVar4 != (xml_attribute_struct *)0x0;
        pxVar4 = pxVar4->next_attribute) {
      if ((pxVar4->name != (char_t *)0x0) &&
         (bVar3 = impl::anon_unknown_0::strequal(attr_name,pxVar4->name), bVar3)) {
        dst = pxVar4->value;
        if (dst == (char_t *)0x0) {
          dst = "";
        }
        bVar3 = impl::anon_unknown_0::strequal(attr_value,dst);
        local_38 = pxVar2;
        if (bVar3) break;
      }
    }
    if (pxVar4 != (xml_attribute_struct *)0x0) {
      return (xml_node)local_38;
    }
    pxVar2 = pxVar2->next_sibling;
    pxVar1 = local_38;
  } while( true );
}

Assistant:

PUGI__FN xml_node xml_node::find_child_by_attribute(const char_t* attr_name, const char_t* attr_value) const
	{
		if (!_root) return xml_node();

		for (xml_node_struct* i = _root->first_child; i; i = i->next_sibling)
			for (xml_attribute_struct* a = i->first_attribute; a; a = a->next_attribute)
				if (a->name && impl::strequal(attr_name, a->name) && impl::strequal(attr_value, a->value ? a->value + 0 : PUGIXML_TEXT("")))
					return xml_node(i);

		return xml_node();
	}